

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.hpp
# Opt level: O0

GLenum Diligent::UsageToGLUsage(BufferDesc *Desc)

{
  CPU_ACCESS_FLAGS CVar1;
  Char *pCVar2;
  undefined1 local_68 [8];
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  BufferDesc *Desc_local;
  
  msg.field_2._8_8_ = Desc;
  switch(Desc->Usage) {
  case USAGE_IMMUTABLE:
    Desc_local._4_4_ = 0x88e4;
    break;
  case USAGE_DEFAULT:
    Desc_local._4_4_ = 0x88e4;
    break;
  case USAGE_DYNAMIC:
    Desc_local._4_4_ = 0x88e8;
    break;
  case USAGE_STAGING:
    CVar1 = operator&(Desc->CPUAccessFlags,CPU_ACCESS_READ);
    if (CVar1 == CPU_ACCESS_NONE) {
      Desc_local._4_4_ = 0x88e6;
    }
    else {
      Desc_local._4_4_ = 0x88e5;
    }
    break;
  case USAGE_UNIFIED:
    Desc_local._4_4_ = 0x88e4;
    break;
  case USAGE_SPARSE:
    FormatString<char[30]>((string *)local_38,(char (*) [30])"USAGE_SPARSE is not supported");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"UsageToGLUsage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x80);
    std::__cxx11::string::~string((string *)local_38);
    Desc_local._4_4_ = 0;
    break;
  default:
    FormatString<char[14]>((string *)local_68,(char (*) [14])"Unknown usage");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"UsageToGLUsage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x81);
    std::__cxx11::string::~string((string *)local_68);
    Desc_local._4_4_ = 0;
  }
  return Desc_local._4_4_;
}

Assistant:

inline GLenum UsageToGLUsage(const BufferDesc& Desc)
{
    static_assert(USAGE_NUM_USAGES == 6, "Please update this function to handle the new usage type");

    // http://www.informit.com/articles/article.aspx?p=2033340&seqNum=2
    // https://www.khronos.org/registry/OpenGL-Refpages/gl2.1/xhtml/glBufferData.xml
    switch (Desc.Usage)
    {
        // STATIC: The data store contents will be modified once and used many times.
        // STREAM: The data store contents will be modified once and used at MOST a few times.
        // DYNAMIC: The data store contents will be modified repeatedly and used many times.

        // clang-format off
        case USAGE_IMMUTABLE:   return GL_STATIC_DRAW;
        case USAGE_DEFAULT:     return GL_STATIC_DRAW;
        case USAGE_UNIFIED:     return GL_STATIC_DRAW;
        case USAGE_DYNAMIC:     return GL_DYNAMIC_DRAW;
        case USAGE_STAGING:
            if(Desc.CPUAccessFlags & CPU_ACCESS_READ)
                return GL_STATIC_READ;
            else
                return GL_STATIC_COPY;
        case USAGE_SPARSE: UNEXPECTED( "USAGE_SPARSE is not supported" ); return 0;
        default:           UNEXPECTED( "Unknown usage" ); return 0;
            // clang-format on
    }
}